

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O1

void __thiscall Heap::sort_down(Heap *this,GridNode *item)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  GridNode *pGVar6;
  GridNode *pGVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  iVar1 = this->count;
  iVar9 = item->index;
  iVar8 = iVar9 * 2 + 1;
  if (iVar8 < iVar1) {
    iVar2 = item->hCost;
    iVar3 = item->gCost;
    do {
      iVar10 = iVar9 * 2 + 2;
      if (iVar10 < iVar1) {
        pGVar6 = this->list[iVar8];
        pGVar7 = this->list[iVar10];
        iVar4 = pGVar7->hCost;
        iVar5 = pGVar6->hCost;
        iVar11 = (pGVar7->gCost + iVar4) - (pGVar6->gCost + iVar5);
        if (iVar11 == 0) {
          iVar11 = iVar4 - iVar5;
        }
        if (iVar11 < 0) {
          iVar8 = iVar10;
        }
      }
      pGVar6 = this->list[iVar8];
      iVar8 = (pGVar6->gCost + pGVar6->hCost) - (iVar3 + iVar2);
      if (iVar8 == 0) {
        iVar8 = pGVar6->hCost - iVar2;
      }
      if (-1 < iVar8) {
        return;
      }
      iVar8 = pGVar6->index;
      this->list[iVar8] = item;
      this->list[iVar9] = pGVar6;
      iVar9 = iVar9 + iVar8;
      pGVar6->index = iVar9;
      iVar9 = iVar9 - item->index;
      item->index = iVar9;
      pGVar6->index = pGVar6->index - iVar9;
      iVar9 = item->index;
      iVar8 = iVar9 * 2 + 1;
    } while (iVar8 < iVar1);
  }
  return;
}

Assistant:

void sort_down(GridNode *item)
    {
        while (true)
        {
            int childIndex1 = item->index * 2 + 1;
            int childIndex2 = item->index * 2 + 2;
            int newIndex = 0;
            if (childIndex1 < count)
            {
                newIndex = childIndex1;
                if (childIndex2 < count)
                {
                    if (list[childIndex1]->compare_item(list[childIndex2]) < 0)
                    {
                        newIndex = childIndex2;
                    }
                }
                if (item->compare_item(list[newIndex]) < 0)
                {
                    swap_items(list[newIndex], item);
                }
                else
                {
                    return;
                }
            }
            else
            {
                return;
            }
        }
    }